

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

DoubletSet * GenerateDoubletTargets(DoubletSet *__return_storage_ptr__,DAM *am,DoubletType type)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Gaussian cur2;
  Gaussian cur1;
  Gaussian local_98;
  Gaussian local_8c;
  ulong local_80;
  ulong local_78;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  char local_40 [16];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8c.ijk._M_elems[0] = (am->dam)._M_elems[0];
  iVar6 = (am->dam)._M_elems[1];
  iVar3 = (local_8c.ijk._M_elems[0] + 2) * (local_8c.ijk._M_elems[0] + 1);
  local_8c.ijk._M_elems[1] = 0;
  local_8c.ijk._M_elems[2] = 0;
  if (1 < iVar3) {
    uVar5 = (iVar6 + 2) * (iVar6 + 1);
    local_80 = (ulong)uVar5;
    do {
      local_98.ijk._M_elems[0] = (am->dam)._M_elems[1];
      local_98.ijk._M_elems[1] = 0;
      local_98.ijk._M_elems[2] = 0;
      iVar6 = (int)uVar5 / 2;
      if (1 < (int)local_80) {
        do {
          local_70._12_4_ = local_8c.ijk._M_elems[2];
          local_70._8_4_ = local_8c.ijk._M_elems[1];
          local_70._4_4_ = local_8c.ijk._M_elems[0];
          local_70._24_4_ = local_98.ijk._M_elems[2];
          local_70._20_4_ = local_98.ijk._M_elems[1];
          local_70._16_4_ = local_98.ijk._M_elems[0];
          pcVar2 = (am->tag)._M_dataplus._M_p;
          local_70._0_4_ = type;
          local_50._M_p = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + (am->tag)._M_string_length);
          std::
          _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
          ::_M_insert_unique<Doublet>(&__return_storage_ptr__->_M_t,(Doublet *)local_70);
          if (local_50._M_p != local_40) {
            operator_delete(local_50._M_p);
          }
          Gaussian::Iterate(&local_98);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      Gaussian::Iterate(&local_8c);
      uVar4 = (int)local_78 + 1;
      local_78 = (ulong)uVar4;
    } while (uVar4 != iVar3 / 2);
  }
  return __return_storage_ptr__;
}

Assistant:

DoubletSet GenerateDoubletTargets(DAM am, DoubletType type)
{
    DoubletSet ds;
    int nam1 = ((am[0] + 1) * (am[0] + 2)) / 2;
    int nam2 = ((am[1] + 1) * (am[1] + 2)) / 2;

    Gaussian cur1 = Gaussian{am[0], 0, 0};
    for(int i = 0; i < nam1; i++)
    {
        Gaussian cur2 = Gaussian{am[1], 0, 0};
        for(int j = 0; j < nam2; j++)
        {
            ds.insert(Doublet{type, cur1, cur2, am.tag});
            cur2.Iterate();
        }
        cur1.Iterate();
    }
                
    return ds;
}